

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlRegFreeAtom(xmlRegAtomPtr atom)

{
  xmlRegRangePtr *ppxVar1;
  xmlRegAtomType xVar2;
  long lVar3;
  
  if (atom == (xmlRegAtomPtr)0x0) {
    return;
  }
  for (lVar3 = 0; ppxVar1 = atom->ranges, lVar3 < atom->nbRanges; lVar3 = lVar3 + 1) {
    xmlRegFreeRange(ppxVar1[lVar3]);
  }
  if (ppxVar1 != (xmlRegRangePtr *)0x0) {
    (*xmlFree)(ppxVar1);
  }
  xVar2 = atom->type;
  if (xVar2 == XML_REGEXP_STRING) {
    if (atom->valuep != (void *)0x0) {
      (*xmlFree)(atom->valuep);
      xVar2 = atom->type;
      if (xVar2 != XML_REGEXP_STRING) goto LAB_001736c1;
    }
    if (atom->valuep2 == (void *)0x0) goto LAB_001736da;
    (*xmlFree)(atom->valuep2);
    xVar2 = atom->type;
  }
LAB_001736c1:
  if ((xVar2 == XML_REGEXP_BLOCK_NAME) && (atom->valuep != (void *)0x0)) {
    (*xmlFree)(atom->valuep);
  }
LAB_001736da:
  (*xmlFree)(atom);
  return;
}

Assistant:

static void
xmlRegFreeAtom(xmlRegAtomPtr atom) {
    int i;

    if (atom == NULL)
	return;

    for (i = 0;i < atom->nbRanges;i++)
	xmlRegFreeRange(atom->ranges[i]);
    if (atom->ranges != NULL)
	xmlFree(atom->ranges);
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep != NULL))
	xmlFree(atom->valuep);
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep2 != NULL))
	xmlFree(atom->valuep2);
    if ((atom->type == XML_REGEXP_BLOCK_NAME) && (atom->valuep != NULL))
	xmlFree(atom->valuep);
    xmlFree(atom);
}